

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

int32_t uprv_copyAscii_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                         UErrorCode *pErrorCode)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  
  iVar4 = 0;
  iVar5 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar5 = iVar4, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR))
  {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (length != 0 && outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (length != 0) {
      iVar3 = length + 1;
      uVar2 = 0;
      do {
        bVar1 = *(byte *)((long)inData + uVar2);
        if (((char)bVar1 < 0) ||
           ((invariantChars[bVar1 >> 5] >> ((int)(char)bVar1 & 0x1fU) & 1) == 0)) {
          udata_printError_63(ds,
                              "uprv_copyFromAscii() string[%d] contains a variant character in position %d\n"
                              ,(ulong)(uint)length,uVar2 & 0xffffffff);
          *pErrorCode = U_INVALID_CHAR_FOUND;
          return 0;
        }
        uVar2 = uVar2 + 1;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
      iVar5 = length;
      if (inData != outData && length != 0) {
        memcpy(outData,inData,(ulong)(uint)length);
      }
    }
  }
  return iVar5;
}

Assistant:

U_CFUNC int32_t
uprv_copyAscii(const UDataSwapper *ds,
               const void *inData, int32_t length, void *outData,
               UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and checking */
    s=(const uint8_t *)inData;
    count=length;
    while(count>0) {
        c=*s++;
        if(!UCHAR_IS_INVARIANT(c)) {
            udata_printError(ds, "uprv_copyFromAscii() string[%d] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        --count;
    }

    if(length>0 && inData!=outData) {
        uprv_memcpy(outData, inData, length);
    }

    return length;
}